

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O0

void __thiscall tcu::StringTemplate::StringTemplate(StringTemplate *this,string *str)

{
  string *str_local;
  StringTemplate *this_local;
  
  std::__cxx11::string::string((string *)this);
  setString(this,str);
  return;
}

Assistant:

StringTemplate::StringTemplate (const std::string& str)
{
	setString(str);
}